

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool,false,true>
               (uhugeint_t *ldata,uhugeint_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  uhugeint_t *puVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uhugeint_t *local_90;
  uhugeint_t local_68;
  uhugeint_t local_58;
  ValidityMask *local_40;
  ulong local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = rdata->lower;
      uVar4 = rdata->upper;
      iVar10 = 0;
      local_90 = ldata;
      do {
        local_58.lower = local_90->lower;
        local_58.upper = local_90->upper;
        local_68.lower = uVar3;
        local_68.upper = uVar4;
        bVar6 = uhugeint_t::operator>(&local_58,&local_68);
        result_data[iVar10] = bVar6;
        iVar10 = iVar10 + 1;
        local_90 = local_90 + 1;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = count + 0x3f >> 6;
    uVar12 = 0;
    uVar11 = 0;
    local_40 = mask;
    local_38 = uVar7;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar13 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar13 = count;
        }
LAB_0035c16b:
        uVar5 = uVar12;
        if (uVar12 < uVar13) {
          uVar3 = rdata->lower;
          uVar4 = rdata->upper;
          puVar8 = ldata + uVar12;
          do {
            local_58.lower = puVar8->lower;
            local_58.upper = puVar8->upper;
            local_68.lower = uVar3;
            local_68.upper = uVar4;
            bVar6 = uhugeint_t::operator>(&local_58,&local_68);
            result_data[uVar12] = bVar6;
            uVar12 = uVar12 + 1;
            puVar8 = puVar8 + 1;
            uVar7 = local_38;
            uVar5 = uVar13;
          } while (uVar13 != uVar12);
        }
      }
      else {
        uVar2 = puVar1[uVar11];
        uVar13 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar13 = count;
        }
        uVar5 = uVar13;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_0035c16b;
          mask = local_40;
          uVar5 = uVar12;
          if (uVar12 < uVar13) {
            puVar8 = ldata + uVar12;
            uVar9 = 0;
            do {
              if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
                local_58.lower = puVar8->lower;
                local_58.upper = puVar8->upper;
                local_68.lower = rdata->lower;
                local_68.upper = rdata->upper;
                bVar6 = uhugeint_t::operator>(&local_58,&local_68);
                result_data[uVar9 + uVar12] = bVar6;
              }
              uVar9 = uVar9 + 1;
              puVar8 = puVar8 + 1;
              uVar7 = local_38;
              mask = local_40;
              uVar5 = uVar13;
            } while (uVar13 - uVar12 != uVar9);
          }
        }
      }
      uVar12 = uVar5;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}